

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# callback.h
# Opt level: O1

callback<void_()> * __thiscall
booster::callback<void()>::operator=(callback<void()> *this,intrusive_ptr<mycall> *c)

{
  intrusive_ptr<booster::callable<void_()>_> iVar1;
  callable<void_()> *tmp;
  intrusive_ptr<booster::callable<void_()>_> local_20;
  intrusive_ptr<booster::callable<void_()>_> local_18;
  
  local_20.p_ = &c->p_->super_callable<void_()>;
  if ((mycall *)local_20.p_ != (mycall *)0x0) {
    booster::atomic_counter::inc();
  }
  iVar1.p_ = local_20.p_;
  local_20.p_ = (callable<void_()> *)0x0;
  local_18.p_ = *(callable<void_()> **)this;
  *(callable<void_()> **)this = iVar1.p_;
  intrusive_ptr<booster::callable<void_()>_>::~intrusive_ptr(&local_18);
  intrusive_ptr<booster::callable<void_()>_>::~intrusive_ptr(&local_20);
  return (callback<void_()> *)this;
}

Assistant:

callback const &operator=(intrusive_ptr<Call> c)		
		{ call_ptr = c; return *this; }